

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_process_directives
              (yaml_parser_t *parser,yaml_version_directive_t **version_directive_ref,
              yaml_tag_directive_t **tag_directives_start_ref,
              yaml_tag_directive_t **tag_directives_end_ref)

{
  anon_union_24_7_b8cffe5e_for_data *paVar1;
  yaml_tag_directive_t *pyVar2;
  yaml_char_t *pyVar3;
  yaml_char_t *pyVar4;
  yaml_tag_directive_t value_00;
  int iVar5;
  bool bVar6;
  yaml_token_t *local_d0;
  yaml_token_t *local_c0;
  yaml_tag_directive_t tag_directive;
  yaml_tag_directive_t value;
  yaml_token_t *token;
  anon_struct_24_3_654a3493 tag_directives;
  yaml_version_directive_t *version_directive;
  yaml_tag_directive_t *default_tag_directive;
  yaml_tag_directive_t default_tag_directives [3];
  yaml_tag_directive_t **tag_directives_end_ref_local;
  yaml_tag_directive_t **tag_directives_start_ref_local;
  yaml_version_directive_t **version_directive_ref_local;
  yaml_parser_t *parser_local;
  
  memcpy(&default_tag_directive,&DAT_0012fdc0,0x30);
  tag_directives.top = (yaml_tag_directive_t *)0x0;
  memset(&token,0,0x18);
  token = (yaml_token_t *)yaml_malloc(0x100);
  if (token == (yaml_token_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    tag_directives.start = (yaml_tag_directive_t *)((long)&token[3].data + 8);
    tag_directives.end = (yaml_tag_directive_t *)token;
    if ((parser->token_available == 0) &&
       (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0)) {
      local_c0 = (yaml_token_t *)0x0;
    }
    else {
      local_c0 = (parser->tokens).head;
    }
    while (local_c0 != (yaml_token_t *)0x0) {
      bVar6 = true;
      if (local_c0->type != YAML_VERSION_DIRECTIVE_TOKEN) {
        bVar6 = local_c0->type == YAML_TAG_DIRECTIVE_TOKEN;
      }
      if (!bVar6) {
        version_directive = (yaml_version_directive_t *)&default_tag_directive;
        while( true ) {
          if (*version_directive == (yaml_version_directive_t)0x0) {
            if (version_directive_ref != (yaml_version_directive_t **)0x0) {
              *version_directive_ref = (yaml_version_directive_t *)tag_directives.top;
            }
            if (tag_directives_start_ref == (yaml_tag_directive_t **)0x0) {
              yaml_free(token);
              tag_directives.start = (yaml_tag_directive_t *)0x0;
              tag_directives.end = (yaml_tag_directive_t *)0x0;
              token = (yaml_token_t *)0x0;
            }
            else if (token == (yaml_token_t *)tag_directives.end) {
              *tag_directives_end_ref = (yaml_tag_directive_t *)0x0;
              *tag_directives_start_ref = (yaml_tag_directive_t *)0x0;
              yaml_free(token);
              tag_directives.start = (yaml_tag_directive_t *)0x0;
              tag_directives.end = (yaml_tag_directive_t *)0x0;
              token = (yaml_token_t *)0x0;
            }
            else {
              *tag_directives_start_ref = (yaml_tag_directive_t *)token;
              *tag_directives_end_ref = tag_directives.end;
            }
            if (version_directive_ref == (yaml_version_directive_t **)0x0) {
              yaml_free(tag_directives.top);
            }
            return 1;
          }
          iVar5 = yaml_parser_append_tag_directive
                            (parser,*(yaml_tag_directive_t *)version_directive,1,
                             local_c0->start_mark);
          if (iVar5 == 0) break;
          version_directive = version_directive + 2;
        }
        break;
      }
      if (local_c0->type == YAML_VERSION_DIRECTIVE_TOKEN) {
        if (tag_directives.top != (yaml_tag_directive_t *)0x0) {
          yaml_parser_set_parser_error
                    (parser,"found duplicate %YAML directive",local_c0->start_mark);
          break;
        }
        if (((local_c0->data).version_directive.major != 1) ||
           ((local_c0->data).version_directive.minor != 1)) {
          yaml_parser_set_parser_error
                    (parser,"found incompatible YAML document",local_c0->start_mark);
          break;
        }
        tag_directives.top = (yaml_tag_directive_t *)yaml_malloc(8);
        if (tag_directives.top == (yaml_tag_directive_t *)0x0) {
          parser->error = YAML_MEMORY_ERROR;
          break;
        }
        *(yaml_encoding_t *)&(tag_directives.top)->handle = (local_c0->data).stream_start.encoding;
        *(int *)((long)&(tag_directives.top)->handle + 4) = (local_c0->data).version_directive.minor
        ;
      }
      else if (local_c0->type == YAML_TAG_DIRECTIVE_TOKEN) {
        paVar1 = &local_c0->data;
        pyVar4 = (paVar1->alias).value;
        pyVar3 = (local_c0->data).tag.suffix;
        value_00.handle = *(yaml_char_t **)paVar1;
        value_00.prefix = *(yaml_char_t **)((long)&paVar1->tag + 8);
        iVar5 = yaml_parser_append_tag_directive(parser,value_00,0,local_c0->start_mark);
        if (iVar5 == 0) break;
        if ((tag_directives.end == tag_directives.start) &&
           (iVar5 = yaml_stack_extend(&token,&tag_directives.end,&tag_directives.start), iVar5 == 0)
           ) {
          parser->error = YAML_MEMORY_ERROR;
          break;
        }
        (tag_directives.end)->handle = pyVar4;
        (tag_directives.end)->prefix = pyVar3;
        tag_directives.end = tag_directives.end + 1;
      }
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = (parser->tokens).head + 1;
      if ((parser->token_available == 0) &&
         (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0)) {
        local_d0 = (yaml_token_t *)0x0;
        local_c0 = local_d0;
      }
      else {
        local_c0 = (parser->tokens).head;
      }
    }
  }
  yaml_free(tag_directives.top);
  while (token != (yaml_token_t *)tag_directives.end) {
    pyVar2 = tag_directives.end + -1;
    pyVar4 = tag_directives.end[-1].prefix;
    tag_directives.end = tag_directives.end + -1;
    yaml_free(pyVar2->handle);
    yaml_free(pyVar4);
  }
  yaml_free(token);
  return 0;
}

Assistant:

static int
yaml_parser_process_directives(yaml_parser_t *parser,
        yaml_version_directive_t **version_directive_ref,
        yaml_tag_directive_t **tag_directives_start_ref,
        yaml_tag_directive_t **tag_directives_end_ref)
{
    yaml_tag_directive_t default_tag_directives[] = {
        {(yaml_char_t *)"!", (yaml_char_t *)"!"},
        {(yaml_char_t *)"!!", (yaml_char_t *)"tag:yaml.org,2002:"},
        {NULL, NULL}
    };
    yaml_tag_directive_t *default_tag_directive;
    yaml_version_directive_t *version_directive = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives = { NULL, NULL, NULL };
    yaml_token_t *token;

    if (!STACK_INIT(parser, tag_directives, yaml_tag_directive_t*))
        goto error;

    token = PEEK_TOKEN(parser);
    if (!token) goto error;

    while (token->type == YAML_VERSION_DIRECTIVE_TOKEN ||
            token->type == YAML_TAG_DIRECTIVE_TOKEN)
    {
        if (token->type == YAML_VERSION_DIRECTIVE_TOKEN) {
            if (version_directive) {
                yaml_parser_set_parser_error(parser,
                        "found duplicate %YAML directive", token->start_mark);
                goto error;
            }
            if (token->data.version_directive.major != 1
                    || token->data.version_directive.minor != 1) {
                yaml_parser_set_parser_error(parser,
                        "found incompatible YAML document", token->start_mark);
                goto error;
            }
            version_directive = YAML_MALLOC_STATIC(yaml_version_directive_t);
            if (!version_directive) {
                parser->error = YAML_MEMORY_ERROR;
                goto error;
            }
            version_directive->major = token->data.version_directive.major;
            version_directive->minor = token->data.version_directive.minor;
        }

        else if (token->type == YAML_TAG_DIRECTIVE_TOKEN) {
            yaml_tag_directive_t value;
            value.handle = token->data.tag_directive.handle;
            value.prefix = token->data.tag_directive.prefix;

            if (!yaml_parser_append_tag_directive(parser, value, 0,
                        token->start_mark))
                goto error;
            if (!PUSH(parser, tag_directives, value))
                goto error;
        }

        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) goto error;
    }

    for (default_tag_directive = default_tag_directives;
            default_tag_directive->handle; default_tag_directive++) {
        if (!yaml_parser_append_tag_directive(parser, *default_tag_directive, 1,
                    token->start_mark))
            goto error;
    }

    if (version_directive_ref) {
        *version_directive_ref = version_directive;
    }
    if (tag_directives_start_ref) {
        if (STACK_EMPTY(parser, tag_directives)) {
            *tag_directives_start_ref = *tag_directives_end_ref = NULL;
            STACK_DEL(parser, tag_directives);
        }
        else {
            *tag_directives_start_ref = tag_directives.start;
            *tag_directives_end_ref = tag_directives.top;
        }
    }
    else {
        STACK_DEL(parser, tag_directives);
    }

    if (!version_directive_ref)
        yaml_free(version_directive);
    return 1;

error:
    yaml_free(version_directive);
    while (!STACK_EMPTY(parser, tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(parser, tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }
    STACK_DEL(parser, tag_directives);
    return 0;
}